

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void defineConfiguration(Graph *g)

{
  int ids_5 [5];
  int ids_4 [13];
  int local_c8 [2];
  int ids_3 [13];
  int i;
  int ids_2 [15];
  int ids_1 [5];
  int ids [5];
  Graph *g_local;
  
  local_c8[0] = 0x54;
  local_c8[1] = 0x55;
  ids_3[0] = 0x56;
  ids_3[1] = 0x57;
  ids_3[2] = 0x58;
  ids_3[3] = 0x59;
  ids_3[4] = 0x5a;
  ids_3[5] = 0x5b;
  ids_3[6] = 0x5c;
  ids_3[7] = 0x5d;
  ids_3[8] = 0x5e;
  ids_3[9] = 0x5f;
  ids_3[10] = 0x60;
  openSwitches(g,local_c8,0xd);
  return;
}

Assistant:

void defineConfiguration(Graph *g) {

    if (input_file == "inputs/sist33barras_Yang.m") {
        int ids[5];

        //CONFIGURACAO INICIAL
        if (configuration == "inicial") {
            ids[0] = 33;
            ids[1] = 34;
            ids[2] = 35;
            ids[3] = 36;
            ids[4] = 37;
        }
        //CONFIGURACAO DA LITERATURA
        if (configuration == "literatura1") {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 32;
            ids[4] = 37;
        }
        //ABORDAGEM ARSD
        if (configuration == "ARSD") {
            ids[0] = 7;
            ids[1] = 9;
            ids[2] = 14;
            ids[3] = 32;
            ids[4] = 37;
        }

        openSwitches(g, ids, 5);
    }

    if (input_file == "inputs/sist33barras_Yang-modificado.m") {
        int ids[5];

        //CONFIGURACAO INICIAL
        if (configuration == "inicial") {
            ids[0] = 33;
            ids[1] = 34;
            ids[2] = 35;
            ids[3] = 36;
            ids[4] = 37;
        }
        //CONFIGURACAO DA LITERATURA
        if (configuration == "literatura1") {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 28;
            ids[4] = 36;
        }
        //ABORDAGEM ARSD
        if (configuration == "ARSD") {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 16;
            ids[4] = 28;
        }

        openSwitches(g, ids, 5);
    }

    if (input_file == "inputs/SISTEMA119s2.m") {
        int ids[15];
        //CONFIGURACAO INICIAL
        if (configuration == "inicial") {
            ids[0] = 119;
            ids[1] = 120;
            ids[2] = 121;
            ids[3] = 122;
            ids[4] = 123;
            ids[5] = 124;
            ids[6] = 125;
            ids[7] = 126;
            ids[8] = 127;
            ids[9] = 128;
            ids[10] = 129;
            ids[11] = 130;
            ids[12] = 131;
            ids[13] = 132;
            ids[14] = 133;
        }
        //CONFIGURACAO DA LITERATURA
        if (configuration == "literatura1") {
            ids[0] = 24;
            ids[1] = 27;
            ids[2] = 35;
            ids[3] = 40;
            ids[4] = 43;
            ids[5] = 52;
            ids[6] = 59;
            ids[7] = 72;
            ids[8] = 75;
            ids[9] = 96;
            ids[10] = 99;
            ids[11] = 110;
            ids[12] = 123;
            ids[13] = 130;
            ids[14] = 131;
        }
        //ABORDAGEM ARSD
        if (configuration == "ARSD") {
            ids[0] = 24;
            ids[1] = 26;
            ids[2] = 35;
            ids[3] = 40;
            ids[4] = 43;
            ids[5] = 51;
            ids[6] = 61;
            ids[7] = 72;
            ids[8] = 75;
            ids[9] = 96;
            ids[10] = 98;
            ids[11] = 110;
            ids[12] = 122;
            ids[13] = 130;
            ids[14] = 131;
        }

        /*
        esse arquivo tem na verdade 132 arcos ao inves de 133 dessa forma os ids dos arcos abertos deve ser subtraido 1.
        */
        for (int i = 0; i < 15; i++)
            ids[i]--;

        openSwitches(g, ids, 15);
    }
    if (input_file == "inputs/SISTEMA83_TAIWAN.m") {
        int ids[13];

        //CONFIGURACAO INICIAL
        if (configuration == "inicial") {
            ids[0] = 84;
            ids[1] = 85;
            ids[2] = 86;
            ids[3] = 87;
            ids[4] = 88;
            ids[5] = 89;
            ids[6] = 90;
            ids[7] = 91;
            ids[8] = 92;
            ids[9] = 93;
            ids[10] = 94;
            ids[11] = 95;
            ids[12] = 96;
        }
        //CONFIGURACAO DA LITERATURA
        if (configuration == "literatura1") {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 39;
            ids[4] = 42;
            ids[5] = 55;
            ids[6] = 62;
            ids[7] = 72;
            ids[8] = 83;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }
        openSwitches(g, ids, 13);
    }
    if (input_file == "inputs/SISTEMA83_TAIWAN_modificado.m") {
        int ids[13];

        //CONFIGURACAO INICIAL
        if (configuration == "inicial") {
            ids[0] = 84;
            ids[1] = 85;
            ids[2] = 86;
            ids[3] = 87;
            ids[4] = 88;
            ids[5] = 89;
            ids[6] = 90;
            ids[7] = 91;
            ids[8] = 92;
            ids[9] = 93;
            ids[10] = 94;
            ids[11] = 95;
            ids[12] = 96;
        }
        //CONFIGURACAO DA LITERATURA
        if (configuration == "literatura1") {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 33;
            ids[3] = 38;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }
        if (configuration == "literatura2") {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 38;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }
        if (configuration == "ARSD") {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 39;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }

        openSwitches(g, ids, 13);
    }
    if (input_file == "inputs/sist69barras.m") {
        int ids[5];

//        ids[0] = 69; ids[1] = 70; ids[2] = 71; ids[3] = 72; ids[4] = 73;
//        ids[0] = 14; ids[1] = 57; ids[2] = 62; ids[3] = 69; ids[4] = 70; // Reconfiguracao + Alocacao
        ids[0] = 14;
        ids[1] = 57;
        ids[2] = 62;
        ids[3] = 69;
        ids[4] = 70; // Reconfiguracao + Alocacao

        openSwitches(g, ids, 5);
    }
}